

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFCopyDescriptor.cpp
# Opt level: O0

void amrex::InterpAddBox(MultiFabCopyDescriptor *fabCopyDesc,BoxList *returnUnfilledBoxes,
                        Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>
                        *returnedFillBoxIds,Box *subbox,MultiFabId faid1,MultiFabId faid2,Real t1,
                        Real t2,Real t,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  double dVar1;
  Real RVar2;
  double dVar3;
  double dVar4;
  FillBoxId *pFVar5;
  Box *in_RCX;
  literals *in_RDI;
  undefined4 in_R8D;
  longdouble x;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  BoxList tempUnfilledBoxes;
  Real teps;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  IndexType in_stack_fffffffffffffec4;
  size_type in_stack_fffffffffffffed8;
  vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *in_stack_fffffffffffffee0;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  int local_d0;
  undefined1 local_a4 [32];
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Box *in_stack_ffffffffffffff88;
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_stack_ffffffffffffff90;
  FabArrayId in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffb0;
  int numcomp;
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  dVar4 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  x = (longdouble)1000.0;
  uVar6 = SUB104(x,0);
  uVar7 = (undefined4)((unkuint10)x >> 0x20);
  RVar2 = literals::operator____rt(in_RDI,x);
  dVar3 = (dVar4 - dVar1) / RVar2;
  uVar9 = (undefined2)in_stack_00000018;
  uVar11 = (undefined2)((uint)in_stack_00000018 >> 0x10);
  if ((in_XMM2_Qa < dVar1 - dVar3) || (dVar1 + dVar3 < in_XMM2_Qa)) {
    if ((in_XMM2_Qa <= dVar4 - dVar3) || (dVar4 + dVar3 <= in_XMM2_Qa)) {
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      numcomp = SUB84(in_XMM2_Qa,0);
      Box::ixType(in_RCX);
      BoxList::BoxList((BoxList *)CONCAT44(uVar7,uVar6),in_stack_fffffffffffffec4);
      uVar6 = in_stack_00000010;
      uVar8 = uVar9;
      uVar10 = uVar11;
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff88,
                 (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffffb0,numcomp);
      pFVar5 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                         ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4.itype,CONCAT22(uVar10,uVar8)),
                          CONCAT44(uVar7,uVar6));
      pFVar5->m_fabIndex = local_d0;
      *(undefined8 *)((pFVar5->m_fillBox).bigend.vect + 1) = local_e0;
      *(undefined8 *)&(pFVar5->m_fillBox).btype = uStack_d8;
      *(undefined8 *)(pFVar5->m_fillBox).smallend.vect = local_f0;
      *(undefined8 *)((pFVar5->m_fillBox).smallend.vect + 2) = uStack_e8;
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff88,
                 (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffffb0,numcomp);
      pFVar5 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                         ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4.itype,CONCAT22(uVar11,uVar9)),
                          CONCAT44(uVar7,in_stack_00000010));
      memcpy(pFVar5,&stack0xfffffffffffffed8,0x24);
      BoxList::~BoxList((BoxList *)0x1291a4c);
    }
    else {
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff88,
                 (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffffb0,SUB84(in_XMM2_Qa,0));
      pFVar5 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                         ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4.itype,CONCAT22(uVar11,uVar9)),
                          CONCAT44(uVar7,in_stack_00000010));
      memcpy(pFVar5,local_a4,0x24);
    }
  }
  else {
    std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff88,
               (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_R8D),in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffffb0,SUB84(in_XMM2_Qa,0));
    pFVar5 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                       ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                        CONCAT44(in_stack_fffffffffffffec4.itype,CONCAT22(uVar11,uVar9)),
                        CONCAT44(uVar7,in_stack_00000010));
    memcpy(pFVar5,&stack0xffffffffffffff84,0x24);
  }
  return;
}

Assistant:

void
InterpAddBox (MultiFabCopyDescriptor& fabCopyDesc,
              BoxList*                returnUnfilledBoxes,
              Vector<FillBoxId>&       returnedFillBoxIds,
              const Box&              subbox,
              MultiFabId              faid1,
              MultiFabId              faid2,
              Real                    t1,
              Real                    t2,
              Real                    t,
              int                     src_comp,
              int                     dest_comp,
              int                     num_comp,
              bool                    extrap)
{
    amrex::ignore_unused(extrap);

    const Real teps = (t2-t1)/1000.0_rt;

    BL_ASSERT(extrap || ( (t>=t1-teps) && (t <= t2+teps) ) );

    if (t >= t1-teps && t <= t1+teps)
    {
        returnedFillBoxIds.resize(1);
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid1,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
    }
    else if (t > t2-teps && t < t2+teps)
    {
        returnedFillBoxIds.resize(1);
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid2,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
    }
    else
    {
        returnedFillBoxIds.resize(2);
        BoxList tempUnfilledBoxes(subbox.ixType());
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid1,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
        returnedFillBoxIds[1] = fabCopyDesc.AddBox(faid2,
                                                   subbox,
                                                   &tempUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
        //
        // The boxarrays for faid1 and faid2 should be the
        // same so only use returnUnfilledBoxes from one AddBox here.
        //
    }
}